

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Link.cpp
# Opt level: O2

void __thiscall TGenericLinker::~TGenericLinker(TGenericLinker *this)

{
  ~TGenericLinker(this);
  operator_delete(this,0xa8);
  return;
}

Assistant:

bool link(TCompilerList&, TUniformMap*) { return true; }